

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

void __thiscall mkvparser::Track::Info::Clear(Info *this)

{
  long in_RDI;
  
  if (*(void **)(in_RDI + 0x30) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x30));
  }
  *(undefined8 *)(in_RDI + 0x30) = 0;
  if (*(void **)(in_RDI + 0x38) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x38));
  }
  *(undefined8 *)(in_RDI + 0x38) = 0;
  if (*(void **)(in_RDI + 0x40) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x40));
  }
  *(undefined8 *)(in_RDI + 0x40) = 0;
  if (*(void **)(in_RDI + 0x50) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x50));
  }
  *(undefined8 *)(in_RDI + 0x50) = 0;
  *(undefined8 *)(in_RDI + 0x58) = 0;
  if (*(void **)(in_RDI + 0x48) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x48));
  }
  *(undefined8 *)(in_RDI + 0x48) = 0;
  return;
}

Assistant:

void Track::Info::Clear() {
  delete[] nameAsUTF8;
  nameAsUTF8 = NULL;

  delete[] language;
  language = NULL;

  delete[] codecId;
  codecId = NULL;

  delete[] codecPrivate;
  codecPrivate = NULL;
  codecPrivateSize = 0;

  delete[] codecNameAsUTF8;
  codecNameAsUTF8 = NULL;
}